

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O1

int64 Js::JavascriptConversion::ToLength(Var aValue,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int64 iVar4;
  INT64 IVar5;
  double value;
  double T1;
  
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    iVar4 = TaggedInt::ToInt64(aValue);
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    return iVar4;
  }
  value = ToInteger_Full(aValue,scriptContext);
  T1 = 0.0;
  if (0.0 <= value) {
    bVar2 = NumberUtilities::IsSpecial(value,0x8000000000000000);
    T1 = 0.0;
    if (!bVar2) {
      T1 = value;
      if (9007199254740991.0 < value) {
        T1 = 9007199254740991.0;
      }
    }
  }
  IVar5 = NumberUtilities::TryToInt64(T1);
  return IVar5;
}

Assistant:

int64 JavascriptConversion::ToLength(Var aValue, ScriptContext* scriptContext)
    {
        if (TaggedInt::Is(aValue))
        {
            int64 length = TaggedInt::ToInt64(aValue);
            return (length < 0) ? 0 : length;
        }

        double length = JavascriptConversion::ToInteger(aValue, scriptContext);

        if (length < 0.0 || JavascriptNumber::IsNegZero(length))
        {
            length = 0.0;
        }
        else if (length > Math::MAX_SAFE_INTEGER)
        {
            length = Math::MAX_SAFE_INTEGER;
        }

        return NumberUtilities::TryToInt64(length);
    }